

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

int __thiscall jrtplib::RTPPacketBuilder::BuildPacket(RTPPacketBuilder *this,void *data,size_t len)

{
  size_t len_local;
  void *data_local;
  RTPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x14;
  }
  else if ((this->defptset & 1U) == 0) {
    this_local._4_4_ = -0x11;
  }
  else if ((this->defmarkset & 1U) == 0) {
    this_local._4_4_ = -0x10;
  }
  else if ((this->deftsset & 1U) == 0) {
    this_local._4_4_ = -0x12;
  }
  else {
    this_local._4_4_ =
         PrivateBuildPacket(this,data,len,this->defaultpayloadtype,(bool)(this->defaultmark & 1),
                            this->defaulttimestampinc,false,0,(void *)0x0,0);
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacketBuilder::BuildPacket(const void *data,size_t len)
{
	if (!init)
		return ERR_RTP_PACKBUILD_NOTINIT;
	if (!defptset)
		return ERR_RTP_PACKBUILD_DEFAULTPAYLOADTYPENOTSET;
	if (!defmarkset)
		return ERR_RTP_PACKBUILD_DEFAULTMARKNOTSET;
	if (!deftsset)
		return ERR_RTP_PACKBUILD_DEFAULTTSINCNOTSET;
	return PrivateBuildPacket(data,len,defaultpayloadtype,defaultmark,defaulttimestampinc,false);
}